

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTests::init
          (CopyImageTests *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  deUint32 format;
  deUint32 format_00;
  Context *pCVar3;
  bool bVar4;
  int extraout_EAX;
  TestCaseGroup *pTVar5;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  TestCaseGroup *this_02;
  char *pcVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr p_Var12;
  int dstFormatNdx;
  long lVar13;
  int srcFormatNdx;
  long lVar14;
  int dstFormatNdx_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonCompressedFormats;
  string viewClassName;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  compressedTextureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  textureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  mixedViewClasses;
  vector<unsigned_int,_std::allocator<unsigned_int>_> compressedFormats;
  
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"non_compressed",
             "Test copying between textures.");
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"compressed",
             "Test copying between compressed textures.");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"mixed",
             "Test copying between compressed and non-compressed textures.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header;
  textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header;
  compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header;
  mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  viewClassName.field_2._M_allocated_capacity = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8814;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d82;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d70;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 1;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8815;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 1;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d83;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 1;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d71;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8230;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d76;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 3;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 3;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d89;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 3;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d77;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8235;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8236;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8239;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8058;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d8e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d7c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c3a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x906f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8059;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f97;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c43;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c3d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8051;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d8f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d7d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f96;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c41;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8233;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8234;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8237;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f95;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 7;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8229;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 7;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8231;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 7;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8232;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 7;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&textureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f94;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 8;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 9;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xb;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xc;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xd;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xe;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xf;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x11;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x12;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x14;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x15;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x16;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x17;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x18;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x19;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1a;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&nonCompressedFormats);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&viewClassName);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&viewClassName);
  viewClassName._M_dataplus._M_p._0_4_ = 8;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9270;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 8;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9271;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 9;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9272;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 9;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9273;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9274;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9275;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xb;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9276;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xb;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9277;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xc;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9278;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xc;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9279;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xd;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xd;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xe;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xe;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xf;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0xf;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x11;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x11;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x12;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x12;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x13;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x13;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x14;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x14;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x15;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x15;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x16;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x16;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x17;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93ba;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x17;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93da;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x18;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bb;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x18;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93db;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x19;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x19;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x1a;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 0x1a;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&compressedTextureFormatViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (pmVar6,(uint *)&nonCompressedFormats);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName.field_2._8_8_ = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&nonCompressedFormats);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::operator=(pmVar7,(pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&viewClassName);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *)&viewClassName);
  viewClassName.field_2._M_allocated_capacity = 0;
  viewClassName.field_2._8_8_ = 0;
  viewClassName._M_dataplus._M_p = (pointer)0x0;
  viewClassName._M_string_length = 0;
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&nonCompressedFormats);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::operator=(pmVar7,(pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&viewClassName);
  std::
  pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::~pair((pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *)&viewClassName);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8814;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d70;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d82;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9278;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9279;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9272;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9273;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93ba;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bb;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93da;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93db;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p = viewClassName._M_dataplus._M_p & 0xffffffff00000000;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dd;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d76;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8230;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->first,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9270;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  viewClassName._M_dataplus._M_p._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&mixedViewClasses,(key_type *)&viewClassName);
  nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9271;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&pmVar7->second,(uint *)&nonCompressedFormats);
  for (p_Var10 = textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var11 = compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left,
      (_Rb_tree_header *)p_Var10 != &textureFormatViewClasses._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    _Var1 = p_Var10[1]._M_color;
    this_02 = (TestCaseGroup *)operator_new(0x78);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar8 = viewClassToName(_Var1);
    TestCaseGroup::TestCaseGroup(this_02,pCVar3,pcVar8,pcVar8);
    tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)this_02);
    p_Var9 = p_Var10[1]._M_parent;
    p_Var12 = p_Var10[1]._M_left;
    for (lVar14 = 0; lVar14 < (int)((ulong)((long)p_Var12 - (long)p_Var9) >> 2); lVar14 = lVar14 + 1
        ) {
      for (lVar13 = 0; lVar13 < (int)((ulong)((long)p_Var12 - (long)p_Var9) >> 2);
          lVar13 = lVar13 + 1) {
        _Var1 = (&p_Var9->_M_color)[lVar14];
        _Var2 = (&p_Var9->_M_color)[lVar13];
        if (((_Var1 == _Var2) || (bVar4 = isFloatFormat(_Var1), !bVar4)) ||
           (bVar4 = isFloatFormat(_Var2), !bVar4)) {
          addCopyTests(this_02,_Var1,_Var2);
        }
        p_Var9 = p_Var10[1]._M_parent;
        p_Var12 = p_Var10[1]._M_left;
      }
    }
  }
  for (; (_Rb_tree_header *)p_Var11 !=
         &compressedTextureFormatViewClasses._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    _Var1 = p_Var11[1]._M_color;
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pcVar8 = viewClassToName(_Var1);
    TestCaseGroup::TestCaseGroup(pTVar5,pCVar3,pcVar8,pcVar8);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar5);
    p_Var10 = p_Var11[1]._M_parent;
    p_Var9 = p_Var11[1]._M_left;
    for (lVar14 = 0; lVar14 < (int)((ulong)((long)p_Var9 - (long)p_Var10) >> 2); lVar14 = lVar14 + 1
        ) {
      for (lVar13 = 0; lVar13 < (int)((ulong)((long)p_Var9 - (long)p_Var10) >> 2);
          lVar13 = lVar13 + 1) {
        _Var1 = (&p_Var10->_M_color)[lVar14];
        _Var2 = (&p_Var10->_M_color)[lVar13];
        if (((_Var1 == _Var2) || (bVar4 = isFloatFormat(_Var1), !bVar4)) ||
           (bVar4 = isFloatFormat(_Var2), !bVar4)) {
          addCopyTests(pTVar5,_Var1,_Var2);
        }
        p_Var10 = p_Var11[1]._M_parent;
        p_Var9 = p_Var11[1]._M_left;
      }
    }
  }
  for (p_Var10 = mixedViewClasses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &mixedViewClasses._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    pcVar8 = viewClassToName(p_Var10[1]._M_color);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nonCompressedFormats,pcVar8,(allocator<char> *)&compressedFormats);
    std::operator+(&viewClassName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nonCompressedFormats,"_mixed");
    std::__cxx11::string::~string((string *)&nonCompressedFormats);
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar5,(this->super_TestCaseGroup).m_context,viewClassName._M_dataplus._M_p,
               viewClassName._M_dataplus._M_p);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&nonCompressedFormats,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var10[1]._M_parent);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&compressedFormats,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var10 + 2));
    tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)pTVar5);
    for (lVar14 = 0;
        lVar14 < (int)((ulong)((long)nonCompressedFormats.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              CONCAT44(nonCompressedFormats.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       nonCompressedFormats.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_)) >> 2);
        lVar14 = lVar14 + 1) {
      for (lVar13 = 0;
          lVar13 < (int)((ulong)((long)compressedFormats.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)compressedFormats.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2);
          lVar13 = lVar13 + 1) {
        format = *(deUint32 *)
                  (CONCAT44(nonCompressedFormats.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            nonCompressedFormats.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar14 * 4);
        format_00 = compressedFormats.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
        if (((format == format_00) || (bVar4 = isFloatFormat(format), !bVar4)) ||
           (bVar4 = isFloatFormat(format_00), !bVar4)) {
          addCopyTests(pTVar5,format,format_00);
          addCopyTests(pTVar5,format_00,format);
        }
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&compressedFormats);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&nonCompressedFormats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              );
    std::__cxx11::string::~string((string *)&viewClassName);
  }
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~map(&mixedViewClasses);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&compressedTextureFormatViewClasses);
  std::
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&textureFormatViewClasses);
  return extraout_EAX;
}

Assistant:

void CopyImageTests::init (void)
{
	TestCaseGroup* const	nonCompressedGroup	= new TestCaseGroup(m_context, "non_compressed", "Test copying between textures.");
	TestCaseGroup* const	compressedGroup		= new TestCaseGroup(m_context, "compressed", "Test copying between compressed textures.");
	TestCaseGroup* const	mixedGroup			= new TestCaseGroup(m_context, "mixed", "Test copying between compressed and non-compressed textures.");

	addChild(nonCompressedGroup);
	addChild(compressedGroup);
	addChild(mixedGroup);

	map<ViewClass, vector<deUint32> >							textureFormatViewClasses;
	map<ViewClass, vector<deUint32> >							compressedTextureFormatViewClasses;
	map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >	mixedViewClasses;

	// Texture view classes
	textureFormatViewClasses[VIEWCLASS_128_BITS]		= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_96_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_64_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_48_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_32_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_24_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_16_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_8_BITS]			= vector<deUint32>();

	// 128bit / VIEWCLASS_128_BITS
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32F);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32I);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32UI);

	// 96bit / VIEWCLASS_96_BITS
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32F);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32I);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32UI);

	// 64bit / VIEWCLASS_64_BITS
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32UI);

	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16UI);

	// 48bit / VIEWCLASS_48_BITS
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16F);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16I);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16UI);

	// 32bit / VIEWCLASS_32_BITS
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R11F_G11F_B10F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2UI);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8_SNORM);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_SRGB8_ALPHA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB9_E5);

	// 24bit / VIEWCLASS_24_BITS
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8I);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8UI);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8_SNORM);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_SRGB8);

	// 16bit / VIEWCLASS_16_BITS
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16F);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16UI);

	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8UI);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8_SNORM);

	// 8bit / VIEWCLASS_8_BITS
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8I);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8UI);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8_SNORM);

	// Compressed texture view classes
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA]	= vector<deUint32>();

	// VIEWCLASS_EAC_R11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_R11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	// VIEWCLASS_EAC_RG11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_RG11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_SIGNED_RG11_EAC);

	// VIEWCLASS_ETC2_RGB
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_RGB8_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_SRGB8_ETC2);

	// VIEWCLASS_ETC2_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2);

	// VIEWCLASS_ETC2_EAC_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);

	// VIEWCLASS_ASTC_4x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);

	// VIEWCLASS_ASTC_5x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);

	// VIEWCLASS_ASTC_5x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);

	// VIEWCLASS_ASTC_6x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);

	// VIEWCLASS_ASTC_6x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);

	// VIEWCLASS_ASTC_8x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);

	// VIEWCLASS_ASTC_8x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);

	// VIEWCLASS_ASTC_8x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);

	// VIEWCLASS_ASTC_10x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);

	// VIEWCLASS_ASTC_10x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);

	// VIEWCLASS_ASTC_10x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);

	// VIEWCLASS_ASTC_10x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);

	// VIEWCLASS_ASTC_12x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);

	// VIEWCLASS_ASTC_12x12_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// Mixed view classes
	mixedViewClasses[VIEWCLASS_128_BITS] = pair<vector<deUint32>, vector<deUint32> >();
	mixedViewClasses[VIEWCLASS_64_BITS] = pair<vector<deUint32>, vector<deUint32> >();

	// 128 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32F);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32UI);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SIGNED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// 64 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16I);

	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_R11_EAC);
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = textureFormatViewClasses.begin(); viewClassIter != textureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		nonCompressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = compressedTextureFormatViewClasses.begin(); viewClassIter != compressedTextureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		compressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >::const_iterator iter = mixedViewClasses.begin(); iter != mixedViewClasses.end(); ++iter)
	{
		const ViewClass			viewClass				= iter->first;
		const string			viewClassName			= string(viewClassToName(viewClass)) + "_mixed";
		TestCaseGroup* const	viewGroup				= new TestCaseGroup(m_context, viewClassName.c_str(), viewClassName.c_str());

		const vector<deUint32>	nonCompressedFormats	= iter->second.first;
		const vector<deUint32>	compressedFormats		= iter->second.second;

		mixedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)nonCompressedFormats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)compressedFormats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = nonCompressedFormats[srcFormatNdx];
			const deUint32 dstFormat = compressedFormats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
			addCopyTests(viewGroup, dstFormat, srcFormat);
		}
	}
}